

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_print_message(nn_options_t *options,char *buf,int buflen)

{
  byte bVar1;
  ushort **ppuVar2;
  int local_1c;
  byte *pbStack_18;
  int buflen_local;
  char *buf_local;
  nn_options_t *options_local;
  
  local_1c = buflen;
  pbStack_18 = (byte *)buf;
  switch(options->echo_format) {
  case NN_NO_ECHO:
    return;
  case NN_ECHO_RAW:
    fwrite(buf,1,(long)buflen,_stdout);
    break;
  case NN_ECHO_ASCII:
    for (; 0 < local_1c; local_1c = local_1c + -1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(char)*pbStack_18] & 0x4000) == 0) {
        fputc(0x2e,_stdout);
      }
      else {
        fputc((int)(char)*pbStack_18,_stdout);
      }
      pbStack_18 = (byte *)((char *)pbStack_18 + 1);
    }
    fputc(10,_stdout);
    break;
  case NN_ECHO_QUOTED:
    fputc(0x22,_stdout);
    for (; 0 < local_1c; local_1c = local_1c + -1) {
      bVar1 = *pbStack_18;
      if (bVar1 == 10) {
        fprintf(_stdout,"\\n");
      }
      else if (bVar1 == 0xd) {
        fprintf(_stdout,"\\r");
      }
      else if ((bVar1 == 0x22) || (bVar1 == 0x5c)) {
        fprintf(_stdout,"\\%c",(ulong)(uint)(int)(char)*pbStack_18);
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(char)*pbStack_18] & 0x4000) == 0) {
          fprintf(_stdout,"\\x%02x",(ulong)*pbStack_18);
        }
        else {
          fputc((int)(char)*pbStack_18,_stdout);
        }
      }
      pbStack_18 = pbStack_18 + 1;
    }
    fprintf(_stdout,"\"\n");
    break;
  case NN_ECHO_MSGPACK:
    if (buflen < 0x100) {
      fputc(-0x3c,_stdout);
      fputc(buflen,_stdout);
      fwrite(buf,1,(long)buflen,_stdout);
    }
    else if (buflen < 0x10000) {
      fputc(-0x3b,_stdout);
      fputc(buflen >> 8,_stdout);
      fputc(buflen & 0xff,_stdout);
      fwrite(buf,1,(long)buflen,_stdout);
    }
    else {
      fputc(-0x3a,_stdout);
      fputc(buflen >> 0x18,_stdout);
      fputc(buflen >> 0x10 & 0xff,_stdout);
      fputc(buflen >> 8 & 0xff,_stdout);
      fputc(buflen & 0xff,_stdout);
      fwrite(buf,1,(long)buflen,_stdout);
    }
    break;
  case NN_ECHO_HEX:
    fputc(0x22,_stdout);
    for (; 0 < local_1c; local_1c = local_1c + -1) {
      fprintf(_stdout,"\\x%02x",(ulong)*pbStack_18);
      pbStack_18 = pbStack_18 + 1;
    }
    fprintf(_stdout,"\"\n");
  }
  fflush(_stdout);
  return;
}

Assistant:

void nn_print_message (nn_options_t *options, char *buf, int buflen)
{
    switch (options->echo_format) {
    case NN_NO_ECHO:
        return;
    case NN_ECHO_RAW:
        fwrite (buf, 1, buflen, stdout);
        break;
    case NN_ECHO_ASCII:
        for (; buflen > 0; --buflen, ++buf) {
            if (isprint (*buf)) {
                fputc (*buf, stdout);
            } else {
                fputc ('.', stdout);
            }
        }
        fputc ('\n', stdout);
        break;
    case NN_ECHO_QUOTED:
        fputc ('"', stdout);
        for (; buflen > 0; --buflen, ++buf) {
            switch (*buf) {
            case '\n':
                fprintf (stdout, "\\n");
                break;
            case '\r':
                fprintf (stdout, "\\r");
                break;
            case '\\':
            case '\"':
                fprintf (stdout, "\\%c", *buf);
                break;
            default:
                if (isprint (*buf)) {
                    fputc (*buf, stdout);
                } else {
                    fprintf (stdout, "\\x%02x", (unsigned char)*buf);
                }
            }
        }
        fprintf (stdout, "\"\n");
        break;
    case NN_ECHO_MSGPACK:
        if (buflen < 256) {
            fputc ('\xc4', stdout);
            fputc (buflen, stdout);
            fwrite (buf, 1, buflen, stdout);
        } else if (buflen < 65536) {
            fputc ('\xc5', stdout);
            fputc (buflen >> 8, stdout);
            fputc (buflen & 0xff, stdout);
            fwrite (buf, 1, buflen, stdout);
        } else {
            fputc ('\xc6', stdout);
            fputc (buflen >> 24, stdout);
            fputc ((buflen >> 16) & 0xff, stdout);
            fputc ((buflen >> 8) & 0xff, stdout);
            fputc (buflen & 0xff, stdout);
            fwrite (buf, 1, buflen, stdout);
        }
        break;
    case NN_ECHO_HEX:
        fputc ('"', stdout);
        for (; buflen > 0; --buflen, ++buf) {
             fprintf (stdout, "\\x%02x", (unsigned char)*buf);
        }
        fprintf (stdout, "\"\n");
        break;
    
    }
    fflush (stdout);
}